

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update.c
# Opt level: O1

void room_update(void)

{
  short sVar1;
  ROOM_INDEX_DATA *pRVar2;
  ROOM_AFFECT_DATA *pRVar3;
  ROOM_AFFECT_DATA *paf;
  ROOM_INDEX_DATA *room;
  
  pRVar2 = top_affected_room;
  while (room = pRVar2, room != (ROOM_INDEX_DATA *)0x0) {
    pRVar2 = room->aff_next;
    pRVar3 = room->affected;
    while (paf = pRVar3, paf != (ROOM_AFFECT_DATA *)0x0) {
      pRVar3 = paf->next;
      if ((paf->duration != 0) && (paf->tick_fun != (RAFF_FUN *)0x0)) {
        (*paf->tick_fun)(room,paf);
      }
      sVar1 = paf->duration;
      if (sVar1 < 1) {
        if (-1 < sVar1) {
          affect_remove_room(room,paf);
        }
      }
      else {
        paf->duration = sVar1 + -1;
      }
    }
  }
  return;
}

Assistant:

void room_update(void)
{
	ROOM_INDEX_DATA *room;
	ROOM_INDEX_DATA *room_next;

	for (room = top_affected_room; room; room = room_next)
	{
		ROOM_AFFECT_DATA *paf;
		ROOM_AFFECT_DATA *paf_next;

		room_next = room->aff_next;

		for (paf = room->affected; paf != nullptr; paf = paf_next)
		{
			paf_next = paf->next;

			if (paf->duration != 0)
			{
				if (paf->tick_fun)
					(*paf->tick_fun)(room, paf);
			}

			if (paf->duration > 0)
				paf->duration--;
			else if (paf->duration < 0); //TODO: possible logic error
			else
				affect_remove_room(room, paf);
		}
	}
}